

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__search_path(char *prog,char *buf,size_t *buflen)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  char *itr;
  char abspath [4096];
  char trypath [4096];
  
  iVar7 = -0x16;
  if ((buflen != (size_t *)0x0 && buf != (char *)0x0) && (*buflen != 0)) {
    pcVar2 = strchr(prog,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = getenv("PATH");
      if (pcVar2 != (char *)0x0) {
        pcVar2 = uv__strdup(pcVar2);
        if (pcVar2 == (char *)0x0) {
          iVar7 = -0xc;
        }
        else {
          pcVar4 = uv__strtok(pcVar2,":",&itr);
          while (pcVar4 != (char *)0x0) {
            snprintf(trypath,0xfff,"%s/%s",pcVar4,prog);
            pcVar4 = realpath(trypath,abspath);
            if (pcVar4 == abspath) {
              iVar1 = access(abspath,1);
              if (iVar1 == 0) {
                sVar5 = strlen(abspath);
                uVar6 = *buflen - 1;
                if (sVar5 <= *buflen - 1) {
                  uVar6 = sVar5;
                }
                *buflen = uVar6;
                memcpy(buf,abspath,uVar6);
                buf[*buflen] = '\0';
                uv__free(pcVar2);
                goto LAB_00160beb;
              }
            }
            pcVar4 = uv__strtok((char *)0x0,":",&itr);
          }
          uv__free(pcVar2);
        }
      }
    }
    else {
      pcVar2 = realpath(prog,abspath);
      if (pcVar2 == abspath) {
        sVar5 = strlen(abspath);
        uVar6 = *buflen - 1;
        if (sVar5 <= *buflen - 1) {
          uVar6 = sVar5;
        }
        *buflen = uVar6;
        memcpy(buf,abspath,uVar6);
        buf[*buflen] = '\0';
LAB_00160beb:
        iVar7 = 0;
      }
      else {
        piVar3 = __errno_location();
        iVar7 = -*piVar3;
      }
    }
  }
  return iVar7;
}

Assistant:

int uv__search_path(const char* prog, char* buf, size_t* buflen) {
  char abspath[UV__PATH_MAX];
  size_t abspath_size;
  char trypath[UV__PATH_MAX];
  char* cloned_path;
  char* path_env;
  char* token;
  char* itr;

  if (buf == NULL || buflen == NULL || *buflen == 0)
    return UV_EINVAL;

  /*
   * Possibilities for prog:
   * i) an absolute path such as: /home/user/myprojects/nodejs/node
   * ii) a relative path such as: ./node or ../myprojects/nodejs/node
   * iii) a bare filename such as "node", after exporting PATH variable
   *     to its location.
   */

  /* Case i) and ii) absolute or relative paths */
  if (strchr(prog, '/') != NULL) {
    if (realpath(prog, abspath) != abspath)
      return UV__ERR(errno);

    abspath_size = strlen(abspath);

    *buflen -= 1;
    if (*buflen > abspath_size)
      *buflen = abspath_size;

    memcpy(buf, abspath, *buflen);
    buf[*buflen] = '\0';

    return 0;
  }

  /* Case iii). Search PATH environment variable */
  cloned_path = NULL;
  token = NULL;
  path_env = getenv("PATH");

  if (path_env == NULL)
    return UV_EINVAL;

  cloned_path = uv__strdup(path_env);
  if (cloned_path == NULL)
    return UV_ENOMEM;

  token = uv__strtok(cloned_path, ":", &itr);
  while (token != NULL) {
    snprintf(trypath, sizeof(trypath) - 1, "%s/%s", token, prog);
    if (realpath(trypath, abspath) == abspath) {
      /* Check the match is executable */
      if (access(abspath, X_OK) == 0) {
        abspath_size = strlen(abspath);

        *buflen -= 1;
        if (*buflen > abspath_size)
          *buflen = abspath_size;

        memcpy(buf, abspath, *buflen);
        buf[*buflen] = '\0';

        uv__free(cloned_path);
        return 0;
      }
    }
    token = uv__strtok(NULL, ":", &itr);
  }
  uv__free(cloned_path);

  /* Out of tokens (path entries), and no match found */
  return UV_EINVAL;
}